

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQuery
          (ClientContext *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,case_insensitive_map_t<BoundParameterData> *values,bool allow_stream_result)

{
  pointer pcVar1;
  pointer pSVar2;
  type pCVar3;
  undefined7 in_register_00000009;
  unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  uVar4;
  unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true> lock;
  string query;
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_c0;
  __uniq_ptr_data<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true,_true>
  local_b0 [16];
  
  uVar4._M_t.
  super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
  .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl._1_7_ =
       in_register_00000009;
  uVar4._M_t.
  super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
  .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl._0_1_ =
       allow_stream_result;
  LockContext((ClientContext *)local_d8);
  pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)values);
  pcVar1 = (pSVar2->query)._M_dataplus._M_p;
  local_d0._M_pi = &local_c0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + (pSVar2->query)._M_string_length);
  pCVar3 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                        *)local_d8);
  CleanupInternal((ClientContext *)statement,pCVar3,(BaseQueryResult *)0x0,false);
  LOCK();
  *(undefined1 *)
   &statement[4].super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
    _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
    super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = 0;
  UNLOCK();
  local_b0[0].
  super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
  .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl =
       (__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
        )(__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
          )uVar4._M_t.
           super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
           .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
  pCVar3 = unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
           ::operator*((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
                        *)local_d8);
  local_e0 = (undefined1  [8])(values->_M_h)._M_buckets;
  (values->_M_h)._M_buckets = (__buckets_ptr)0x0;
  PendingQueryInternal
            (this,(ClientContextLock *)statement,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             pCVar3,(PendingQueryParameters *)local_e0,SUB81(local_b0,0));
  if (local_e0 != (undefined1  [8])0x0) {
    (*(code *)((__node_base_ptr)((_Hashtable *)local_e0)->_M_buckets)[1]._M_nxt)();
  }
  local_e0 = (undefined1  [8])0x0;
  if (local_d0._M_pi != &local_c0) {
    operator_delete(local_d0._M_pi);
  }
  ::std::unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>::
  ~unique_ptr((unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>
               *)local_d8);
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQuery(unique_ptr<SQLStatement> statement,
                                                           case_insensitive_map_t<BoundParameterData> &values,
                                                           bool allow_stream_result) {
	auto lock = LockContext();
	auto query = statement->query;
	try {
		InitialCleanup(*lock);

		PendingQueryParameters params;
		params.allow_stream_result = allow_stream_result;
		params.parameters = values;

		return PendingQueryInternal(*lock, std::move(statement), params, true);
	} catch (std::exception &ex) {
		return make_uniq<PendingQueryResult>(ErrorData(ex));
	}
}